

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_fe *a_00;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  secp256k1_ge *psVar9;
  ulong uVar10;
  byte bVar11;
  
  bVar11 = 0;
  secp256k1_ge_verify(a);
  psVar9 = r;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar9->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((long)a + (ulong)bVar11 * -0x10 + 8);
    psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
  }
  a_00 = &r->y;
  secp256k1_fe_verify(a_00);
  uVar1 = (r->y).n[4];
  uVar7 = (uVar1 >> 0x30) * 0x1000003d1 + (r->y).n[0];
  uVar5 = (uVar7 >> 0x34) + (r->y).n[1];
  uVar8 = (uVar5 >> 0x34) + (r->y).n[2];
  uVar10 = (uVar8 >> 0x34) + (r->y).n[3];
  (r->y).n[0] = uVar7 & 0xfffffffffffff;
  (r->y).n[1] = uVar5 & 0xfffffffffffff;
  (r->y).n[2] = uVar8 & 0xfffffffffffff;
  (r->y).n[3] = uVar10 & 0xfffffffffffff;
  (r->y).n[4] = (uVar10 >> 0x34) + (uVar1 & 0xffffffffffff);
  (r->y).magnitude = 1;
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify_magnitude(a_00,1);
  uVar2 = (r->y).n[1];
  uVar3 = (r->y).n[2];
  uVar4 = (r->y).n[3];
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - uVar2;
  (r->y).n[2] = 0x3ffffffffffffc - uVar3;
  (r->y).n[3] = 0x3ffffffffffffc - uVar4;
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  (r->y).magnitude = 2;
  (r->y).normalized = 0;
  secp256k1_fe_verify(a_00);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    SECP256K1_GE_VERIFY(a);

    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GE_VERIFY(r);
}